

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_to_core.cpp
# Opt level: O3

Literal * skiwi::anon_unknown_26::_make_false(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Literal *pLVar2;
  Literal *extraout_RAX;
  variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
  *in_RDI;
  False local_58;
  
  *(undefined8 *)in_RDI = 0xffffffffffffffff;
  in_RDI[9] = (variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
               )0x0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
    **)(in_RDI + 0x20) = in_RDI + 0x30;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  in_RDI[0x30] = (variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
                  )0x0;
  in_RDI[0x60] = (variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
                  )0x0;
  paVar1 = &local_58.filename.field_2;
  local_58.tail_position = false;
  local_58.pre_scan_index = 0;
  local_58.scan_index = 0;
  local_58.filename._M_string_length = 0;
  local_58.filename.field_2._M_local_buf[0] = '\0';
  local_58.line_nr = -1;
  local_58.column_nr = -1;
  local_58.filename._M_dataplus._M_p = (pointer)paVar1;
  pLVar2 = std::
           variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
           ::operator=(in_RDI,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.filename._M_dataplus._M_p,
                    CONCAT71(local_58.filename.field_2._M_allocated_capacity._1_7_,
                             local_58.filename.field_2._M_local_buf[0]) + 1);
    pLVar2 = extraout_RAX;
  }
  return pLVar2;
}

Assistant:

Literal _make_false()
    {
    Literal lit;
    False fa;
    fa.line_nr = -1;
    fa.column_nr = -1;
    lit = fa;
    return lit;
    }